

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManResetMatches(Nf_Man_t *p,int Round)

{
  word wVar1;
  Nf_Cfg_t NVar2;
  undefined4 uVar3;
  Nf_Cfg_t NVar4;
  int iVar5;
  int c_00;
  uint uVar6;
  Nf_Mat_t *pNVar7;
  Nf_Mat_t *pNVar8;
  int *piVar9;
  word wVar10;
  bool bVar11;
  word local_a8;
  Nf_Mat_t t_1;
  Nf_Mat_t t;
  int c;
  int i;
  word Arrival;
  Nf_Mat_t *pM [2];
  Nf_Mat_t *pMfan;
  Nf_Mat_t *pAc;
  Nf_Mat_t *pDc;
  Gia_Obj_t *pObj;
  int Round_local;
  Nf_Man_t *p_local;
  
  t.A._4_4_ = 0;
  do {
    bVar11 = false;
    if (t.A._4_4_ < p->pGia->nObjs) {
      pDc = (Nf_Mat_t *)Gia_ManObj(p->pGia,t.A._4_4_);
      bVar11 = pDc != (Nf_Mat_t *)0x0;
    }
    if (!bVar11) {
      return;
    }
    iVar5 = Gia_ObjIsAnd((Gia_Obj_t *)pDc);
    if (iVar5 != 0) {
      iVar5 = Gia_ObjIsBuf((Gia_Obj_t *)pDc);
      if (iVar5 == 0) {
        for (t.A._0_4_ = 0; (int)t.A < 2; t.A._0_4_ = (int)t.A + 1) {
          pNVar7 = Nf_ObjMatchD(p,t.A._4_4_,(int)t.A);
          pNVar8 = Nf_ObjMatchA(p,t.A._4_4_,(int)t.A);
          pNVar8->A = 0;
          pNVar7->A = 0;
          iVar5 = Nf_ObjMapRefNum(p,t.A._4_4_,(int)t.A);
          if (iVar5 == 0) {
            if ((Round < 1) && ((*(int *)pNVar7 < 0 || (*(int *)pNVar8 < 0)))) {
              __assert_fail("Round > 0 || (!pDc->fBest && !pAc->fBest)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x769,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            if (((p->pPars->fAreaOnly != 0) || ((Round & 1U) != 0)) &&
               ((*(uint *)pNVar8 >> 0x1e & 1) == 0)) {
              uVar3 = *(undefined4 *)&pNVar7->field_0x0;
              NVar4 = pNVar7->Cfg;
              wVar10 = pNVar7->D;
              wVar1 = pNVar7->A;
              NVar2 = pNVar8->Cfg;
              *(undefined4 *)&pNVar7->field_0x0 = *(undefined4 *)&pNVar8->field_0x0;
              pNVar7->Cfg = NVar2;
              pNVar7->D = pNVar8->D;
              pNVar7->A = pNVar8->A;
              *(undefined4 *)&pNVar8->field_0x0 = uVar3;
              pNVar8->Cfg = NVar4;
              pNVar8->D = wVar10;
              pNVar8->A = wVar1;
            }
            *(uint *)pNVar7 = *(uint *)pNVar7 & 0x7fffffff | 0x80000000;
            *(uint *)pNVar8 = *(uint *)pNVar8 & 0x7fffffff;
          }
          else {
            if (*(uint *)pNVar7 >> 0x1f == *(uint *)pNVar8 >> 0x1f) {
              __assert_fail("pDc->fBest != pAc->fBest",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x761,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            if (*(int *)pNVar8 < 0) {
              uVar3 = *(undefined4 *)&pNVar7->field_0x0;
              NVar4 = pNVar7->Cfg;
              wVar10 = pNVar7->D;
              wVar1 = pNVar7->A;
              NVar2 = pNVar8->Cfg;
              *(undefined4 *)&pNVar7->field_0x0 = *(undefined4 *)&pNVar8->field_0x0;
              pNVar7->Cfg = NVar2;
              pNVar7->D = pNVar8->D;
              pNVar7->A = pNVar8->A;
              *(undefined4 *)&pNVar8->field_0x0 = uVar3;
              pNVar8->Cfg = NVar4;
              pNVar8->D = wVar10;
              pNVar8->A = wVar1;
            }
            if (-1 < *(int *)pNVar7) {
              __assert_fail("pDc->fBest",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x764,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            if (*(int *)pNVar8 < 0) {
              __assert_fail("!pAc->fBest",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x765,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
          }
        }
        pNVar7 = Nf_ObjMatchD(p,t.A._4_4_,0);
        pM[0] = Nf_ObjMatchD(p,t.A._4_4_,1);
        if ((-1 < *(int *)pNVar7) || (-1 < *(int *)pM[0])) {
          __assert_fail("pM[0]->fBest && pM[1]->fBest",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                        ,0x773,"void Nf_ManResetMatches(Nf_Man_t *, int)");
        }
        if (((*(uint *)pNVar7 >> 0x1e & 1) != 0) && ((*(uint *)pM[0] >> 0x1e & 1) != 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                        ,0x779,"void Nf_ManResetMatches(Nf_Man_t *, int)");
        }
        if (((*(uint *)pNVar7 >> 0x1e & 1) == 0) && ((*(uint *)pM[0] >> 0x1e & 1) == 0)) {
          for (t.A._0_4_ = 0; (int)t.A < 2; t.A._0_4_ = (int)t.A + 1) {
            pNVar7 = pM[(long)(int)t.A + -1];
            piVar9 = Nf_ObjCutSet(p,t.A._4_4_);
            wVar10 = Nf_ManComputeArrival(p,pNVar7,piVar9);
            pM[(long)(int)t.A + -1]->D = wVar10;
          }
        }
        else {
          uVar6 = (uint)(((*(uint *)pM[0] >> 0x1e & 1) != 0 ^ 0xffU) & 1);
          if ((*(uint *)pM[(long)(int)uVar6 + -1] >> 0x1e & 1) != 0) {
            __assert_fail("!pM[c]->fCompl",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x789,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
          if ((*(uint *)pM[(long)(int)(uint)((uVar6 != 0 ^ 0xffU) & 1) + -1] >> 0x1e & 1) == 0) {
            __assert_fail("pM[!c]->fCompl",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x78a,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
          pNVar7 = pM[(long)(int)uVar6 + -1];
          piVar9 = Nf_ObjCutSet(p,t.A._4_4_);
          wVar10 = Nf_ManComputeArrival(p,pNVar7,piVar9);
          pM[(long)(int)uVar6 + -1]->D = wVar10;
          pNVar7 = pM[(long)(int)(uint)((uVar6 != 0 ^ 0xffU) & 1) + -1];
          pNVar8 = pM[(long)(int)uVar6 + -1];
          NVar2 = pNVar8->Cfg;
          *(undefined4 *)&pNVar7->field_0x0 = *(undefined4 *)&pNVar8->field_0x0;
          pNVar7->Cfg = NVar2;
          pNVar7->D = pNVar8->D;
          pNVar7->A = pNVar8->A;
          pM[(long)(int)(uint)((uVar6 != 0 ^ 0xffU) & 1) + -1]->D =
               p->InvDelay + pM[(long)(int)(uint)((uVar6 != 0 ^ 0xffU) & 1) + -1]->D;
          *(uint *)pM[(long)(int)(uint)((uVar6 != 0 ^ 0xffU) & 1) + -1] =
               *(uint *)pM[(long)(int)(uint)((uVar6 != 0 ^ 0xffU) & 1) + -1] & 0xbfffffff |
               0x40000000;
        }
      }
      else {
        iVar5 = Gia_ObjFaninId0((Gia_Obj_t *)pDc,t.A._4_4_);
        c_00 = Gia_ObjFaninC0((Gia_Obj_t *)pDc);
        pM[1] = Nf_ObjMatchBest(p,iVar5,c_00);
        for (t.A._0_4_ = 0; (int)t.A < 2; t.A._0_4_ = (int)t.A + 1) {
          pNVar7 = Nf_ObjMatchD(p,t.A._4_4_,(int)t.A);
          pNVar8 = Nf_ObjMatchA(p,t.A._4_4_,(int)t.A);
          pNVar8->A = 0;
          pNVar7->A = 0;
          if ((int)t.A == 0) {
            local_a8 = 0;
          }
          else {
            local_a8 = p->InvArea;
          }
          pNVar7->D = pM[1]->D + local_a8;
          if (-1 < *(int *)pNVar7) {
            __assert_fail("pDc->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x753,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
          if (*(int *)pNVar8 < 0) {
            __assert_fail("!pAc->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x754,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
          if (((int)t.A != 0) && ((*(uint *)pNVar7 >> 0x1e & 1) == 0)) {
            __assert_fail("c==0 || pDc->fCompl",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x755,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
        }
      }
    }
    t.A._4_4_ = t.A._4_4_ + 1;
  } while( true );
}

Assistant:

void Nf_ManResetMatches( Nf_Man_t * p, int Round )
{
    Gia_Obj_t * pObj;
    Nf_Mat_t * pDc, * pAc, * pMfan, * pM[2]; 
    word Arrival; int i, c;
    // go through matches in the topo order
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pMfan = Nf_ObjMatchBest( p, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj) );
            for ( c = 0; c < 2; c++ )
            {
                pDc = Nf_ObjMatchD( p, i, c );
                pAc = Nf_ObjMatchA( p, i, c );
                pDc->A = pAc->A = 0;
                pDc->D = pMfan->D + (c ? p->InvArea : 0); 
                assert( pDc->fBest );
                assert( !pAc->fBest );
                assert( c==0 || pDc->fCompl );
            }
            continue;
        }
        // select the best match for each phase
        for ( c = 0; c < 2; c++ )
        {
            pDc = Nf_ObjMatchD( p, i, c );
            pAc = Nf_ObjMatchA( p, i, c );
            pDc->A = pAc->A = 0;
            if ( Nf_ObjMapRefNum(p, i, c) )
            {
                assert( pDc->fBest != pAc->fBest );
                if ( pAc->fBest )
                    ABC_SWAP( Nf_Mat_t, *pDc, *pAc );
                assert( pDc->fBest );
                assert( !pAc->fBest );
            }
            else
            {
                assert( Round > 0 || (!pDc->fBest && !pAc->fBest) );
                if ( (p->pPars->fAreaOnly || (Round & 1)) && !pAc->fCompl )
                    ABC_SWAP( Nf_Mat_t, *pDc, *pAc );
                pDc->fBest = 1;
                pAc->fBest = 0;
            }
        }
        // consider best matches of both phases
        pM[0] = Nf_ObjMatchD( p, i, 0 );
        pM[1] = Nf_ObjMatchD( p, i, 1 );
        assert( pM[0]->fBest && pM[1]->fBest );
        // swap complemented matches
        if ( pM[0]->fCompl && pM[1]->fCompl )
        {
//            pM[0]->fCompl = pM[1]->fCompl = 0;
//            ABC_SWAP( Nf_Mat_t *, pM[0], pM[1] );
            assert( 0 );
        }
        if ( !pM[0]->fCompl && !pM[1]->fCompl )
        {
            for ( c = 0; c < 2; c++ )
            {
                Arrival = Nf_ManComputeArrival( p, pM[c], Nf_ObjCutSet(p, i) );
                //if ( Nf_ObjMapRefNum(p, i, c) )
                //    assert( Round || Arrival <= pM[c]->D );
                pM[c]->D = Arrival;
            }
        }
        else 
        {
            // consider non-complemented match
            c = !pM[1]->fCompl;
            assert( !pM[c]->fCompl );
            assert( pM[!c]->fCompl );
            Arrival = Nf_ManComputeArrival( p, pM[c], Nf_ObjCutSet(p, i) );
            //if ( Nf_ObjMapRefNum(p, i, c) )
            //    assert( Round || Arrival <= pM[c]->D );
            pM[c]->D = Arrival;
            // consider complemented match
            Arrival = pM[!c]->D;
            *pM[!c] = *pM[c];
            pM[!c]->D += p->InvDelay;
            pM[!c]->fCompl = 1;
            //if ( Nf_ObjMapRefNum(p, i, !c) )
            //    assert( Round || pM[!c]->D <= Arrival );
        }
    }
}